

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::relative_path(path *__return_storage_ptr__,path *this)

{
  string_type sStack_38;
  
  root_name_length(this);
  has_root_directory(this);
  std::__cxx11::string::substr((ulong)&sStack_38,(ulong)this);
  path(__return_storage_ptr__,&sStack_38,generic_format);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return path(_path.substr((std::min)(rootPathLen, _path.length())), generic_format);
}